

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * ON_Font::GetManagedFont(double point_size,wchar_t *face_name)

{
  ON_Font *pOVar1;
  bool bItalic;
  bool bBold;
  wchar_t *face_name_local;
  double point_size_local;
  
  pOVar1 = GetManagedFont(point_size,face_name,false,false);
  return pOVar1;
}

Assistant:

const ON_Font* ON_Font::GetManagedFont(
  double point_size,
  const wchar_t* face_name
  )
{
  const bool bBold = false;
  const bool bItalic = false;

  return ON_Font::GetManagedFont(
    point_size,
    face_name,
    bBold,
    bItalic
    );
}